

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnStoreExpr
          (BinaryReaderIR *this,Opcode opcode,uint32_t alignment_log2,Address offset)

{
  Result RVar1;
  pointer *__ptr;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  
  local_28._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0x48);
  *(long *)((long)local_28._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_28._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)local_28._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)local_28._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x24) = 0;
  *(undefined8 *)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x2c) = 0;
  *(undefined4 *)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x38) = 0x2c;
  *(undefined ***)
   local_28._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
   super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = &PTR__Expr_001a0ad8;
  *(Enum *)((long)local_28._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x3c) = opcode.enum_;
  *(int *)((long)local_28._M_t.
                 super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                 super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40) =
       1 << ((byte)alignment_log2 & 0x1f);
  *(Address *)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x44) = offset;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_28);
  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
      local_28._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnStoreExpr(Opcode opcode,
                                   uint32_t alignment_log2,
                                   Address offset) {
  return AppendExpr(MakeUnique<StoreExpr>(opcode, 1 << alignment_log2, offset));
}